

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_8df1c::CheckTypeConflict
          (anon_unknown_dwarf_8df1c *this,ExpressionContext *ctx,SynBase *source,InplaceStr name)

{
  uint nameHash;
  IdentifierLookupResult *pIVar1;
  NamespaceData *pNVar2;
  anon_unknown_dwarf_8df1c *paVar3;
  InplaceStr name_00;
  IdentifierLookupResult *lookup;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  InplaceStr name_local;
  
  paVar3 = (anon_unknown_dwarf_8df1c *)name.begin;
  ctx_local = (ExpressionContext *)source;
  name_local.begin = (char *)paVar3;
  nameHash = InplaceStr::hash((InplaceStr *)&ctx_local);
  pIVar1 = LookupObjectByName((ExpressionContext *)this,nameHash);
  if (((pIVar1 != (IdentifierLookupResult *)0x0) && (pIVar1->variable != (VariableData *)0x0)) &&
     (paVar3 = this, pIVar1->variable->scope == *(ScopeData **)(this + 0x8158))) {
    paVar3 = (anon_unknown_dwarf_8df1c *)(ulong)(uint)((int)name_local.begin - (int)ctx_local);
    Report((ExpressionContext *)this,(SynBase *)ctx,
           "ERROR: name \'%.*s\' is already taken for a variable in current scope",paVar3,ctx_local)
    ;
  }
  name_00.end = (char *)paVar3;
  name_00.begin = name_local.begin;
  pNVar2 = FindNamespaceInCurrentScope(this,ctx_local,name_00);
  if (pNVar2 != (NamespaceData *)0x0) {
    Report((ExpressionContext *)this,(SynBase *)ctx,
           "ERROR: name \'%.*s\' is already taken for a namespace",
           (ulong)(uint)((int)name_local.begin - (int)ctx_local),ctx_local);
  }
  return;
}

Assistant:

void CheckTypeConflict(ExpressionContext &ctx, SynBase *source, InplaceStr name)
	{
		if(IdentifierLookupResult *lookup = LookupObjectByName(ctx, name.hash()))
		{
			if(lookup->variable && lookup->variable->scope == ctx.scope)
				Report(ctx, source, "ERROR: name '%.*s' is already taken for a variable in current scope", FMT_ISTR(name));
		}

		if(FindNamespaceInCurrentScope(ctx, name))
			Report(ctx, source, "ERROR: name '%.*s' is already taken for a namespace", FMT_ISTR(name));
	}